

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-readdir.c
# Opt level: O2

void empty_readdir_cb(uv_fs_t *req)

{
  void *dir;
  int iVar1;
  uv_loop_t *loop;
  char *__format;
  char *pcVar2;
  char *pcVar3;
  undefined8 uVar4;
  int64_t eval_b;
  int64_t eval_a;
  
  dir = readdir_req.ptr;
  if (req == &readdir_req) {
    eval_a = (int64_t)readdir_req.fs_type;
    eval_b = 0x20;
    if (eval_a == 0x20) {
      eval_a = readdir_req.result;
      eval_b = 0;
      if (readdir_req.result == 0) {
        uv_fs_req_cleanup(&readdir_req);
        loop = uv_default_loop();
        iVar1 = uv_fs_closedir(loop,&closedir_req,(uv_dir_t *)dir,empty_closedir_cb);
        eval_a = (int64_t)iVar1;
        eval_b = 0;
        if (eval_a == 0) {
          return;
        }
        pcVar3 = "0";
        pcVar2 = "r";
        uVar4 = 0x46;
      }
      else {
        pcVar3 = "0";
        pcVar2 = "req->result";
        uVar4 = 0x3f;
      }
    }
    else {
      pcVar3 = "UV_FS_READDIR";
      pcVar2 = "req->fs_type";
      uVar4 = 0x3e;
    }
    __format = "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n";
  }
  else {
    __format = "Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n";
    pcVar2 = "req";
    uVar4 = 0x3d;
    pcVar3 = "&readdir_req";
    eval_a = (int64_t)req;
    eval_b = (int64_t)&readdir_req;
  }
  fprintf(_stderr,__format,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-readdir.c"
          ,uVar4,pcVar2,"==",pcVar3,eval_a,"==",eval_b);
  abort();
}

Assistant:

static void empty_readdir_cb(uv_fs_t* req) {
  uv_dir_t* dir;
  int r;

  ASSERT_PTR_EQ(req, &readdir_req);
  ASSERT_EQ(req->fs_type, UV_FS_READDIR);
  ASSERT_OK(req->result);
  dir = req->ptr;
  uv_fs_req_cleanup(req);
  r = uv_fs_closedir(uv_default_loop(),
                     &closedir_req,
                     dir,
                     empty_closedir_cb);
  ASSERT_OK(r);
}